

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::NegativeTexParameterCase::iterate
          (NegativeTexParameterCase *this)

{
  deUint32 *this_00;
  bool bVar1;
  ContextType ctxType;
  ApiType requiredApiType;
  deUint32 texture_00;
  GLenum GVar2;
  GLenum GVar3;
  GLint param;
  int iVar4;
  TestLog *pTVar5;
  RenderContext *pRVar6;
  ContextInfo *this_01;
  MessageBuilder *pMVar7;
  undefined4 extraout_var;
  Enum<int,_2UL> EVar8;
  Enum<int,_2UL> local_450;
  GetNameFunc local_440;
  int local_438;
  Enum<int,_2UL> local_430;
  MessageBuilder local_420;
  GLenum local_29c;
  undefined1 local_298 [4];
  GLenum error;
  Texture texture;
  CallLogWrapper gl;
  undefined1 local_d8 [7];
  bool supportsES32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  string local_40;
  ScopedLogSection local_20;
  ScopedLogSection scope;
  NegativeTexParameterCase *this_local;
  
  scope.m_log = (TestLog *)this;
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Iteration",&local_41);
  std::__cxx11::string::string((string *)local_d8);
  std::operator+(&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 "Testing parameter with ");
  std::operator+(&local_98,&local_b8,iterate::types[this->m_iteration].name);
  std::operator+(&local_78,&local_98," texture");
  tcu::ScopedLogSection::ScopedLogSection(&local_20,pTVar5,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  pRVar6 = Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar6->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  if (((iterate::types[this->m_iteration].isArrayType & 1U) != 0) && (!bVar1)) {
    this_01 = Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (this_01,"GL_OES_texture_storage_multisample_2d_array");
    if (!bVar1) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&gl.m_enableLog,pTVar5,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&gl.m_enableLog,
                          (char (*) [75])
                          "GL_OES_texture_storage_multisample_2d_array not supported, skipping target"
                         );
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&gl.m_enableLog);
      goto LAB_0083b18f;
    }
  }
  pRVar6 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)&texture.super_ObjectWrapper.m_object,
             (Functions *)CONCAT44(extraout_var,iVar4),pTVar5);
  pRVar6 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)local_298,pRVar6);
  this_00 = &texture.super_ObjectWrapper.m_object;
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)this_00,true);
  GVar2 = iterate::types[this->m_iteration].target;
  texture_00 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_298);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)this_00,GVar2,texture_00);
  if ((iterate::types[this->m_iteration].isArrayType & 1U) == 0) {
    glu::CallLogWrapper::glTexStorage2DMultisample
              ((CallLogWrapper *)&texture.super_ObjectWrapper.m_object,
               iterate::types[this->m_iteration].target,1,
               iterate::types[this->m_iteration].internalFormat,0x10,0x10,'\0');
  }
  else {
    glu::CallLogWrapper::glTexStorage3DMultisample
              ((CallLogWrapper *)&texture.super_ObjectWrapper.m_object,
               iterate::types[this->m_iteration].target,1,
               iterate::types[this->m_iteration].internalFormat,0x10,0x10,0x10,'\0');
  }
  GVar2 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&texture.super_ObjectWrapper.m_object);
  glu::checkError(GVar2,"setup texture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x767);
  GVar2 = iterate::types[this->m_iteration].target;
  GVar3 = getParamGLEnum(this);
  param = getParamValue(this);
  glu::CallLogWrapper::glTexParameteri
            ((CallLogWrapper *)&texture.super_ObjectWrapper.m_object,GVar2,GVar3,param);
  GVar2 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&texture.super_ObjectWrapper.m_object);
  local_29c = GVar2;
  GVar3 = getExpectedError(this);
  if (GVar2 != GVar3) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_420,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_420,(char (*) [23])"Got unexpected error: ");
    EVar8 = glu::getErrorStr(local_29c);
    local_440 = EVar8.m_getName;
    local_438 = EVar8.m_value;
    local_430.m_getName = local_440;
    local_430.m_value = local_438;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_430);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [13])", expected: ");
    GVar2 = getExpectedError(this);
    EVar8 = glu::getErrorStr(GVar2);
    local_450.m_getName = EVar8.m_getName;
    local_450.m_value = EVar8.m_value;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_450);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_420);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Got wrong error code");
  }
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)local_298);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)&texture.super_ObjectWrapper.m_object);
LAB_0083b18f:
  iVar4 = this->m_iteration + 1;
  this->m_iteration = iVar4;
  this_local._4_4_ = (IterateResult)(iVar4 < 6);
  tcu::ScopedLogSection::~ScopedLogSection(&local_20);
  return this_local._4_4_;
}

Assistant:

NegativeTexParameterCase::IterateResult NegativeTexParameterCase::iterate (void)
{
	static const struct TextureType
	{
		const char*	name;
		glw::GLenum	target;
		glw::GLenum	internalFormat;
		bool		isArrayType;
	} types[] =
	{
		{ "color",					GL_TEXTURE_2D_MULTISAMPLE,			GL_RGBA8,	false	},
		{ "color array",			GL_TEXTURE_2D_MULTISAMPLE_ARRAY,	GL_RGBA8,	true	},
		{ "signed integer",			GL_TEXTURE_2D_MULTISAMPLE,			GL_R8I,		false	},
		{ "signed integer array",	GL_TEXTURE_2D_MULTISAMPLE_ARRAY,	GL_R8I,		true	},
		{ "unsigned integer",		GL_TEXTURE_2D_MULTISAMPLE,			GL_R8UI,	false	},
		{ "unsigned integer array",	GL_TEXTURE_2D_MULTISAMPLE_ARRAY,	GL_R8UI,	true	},
	};

	const tcu::ScopedLogSection scope(m_testCtx.getLog(), "Iteration", std::string() + "Testing parameter with " + types[m_iteration].name + " texture");
	const bool					supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (types[m_iteration].isArrayType && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_OES_texture_storage_multisample_2d_array not supported, skipping target" << tcu::TestLog::EndMessage;
	else
	{
		glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
		glu::Texture			texture	(m_context.getRenderContext());
		glw::GLenum				error;

		gl.enableLogging(true);

		// gen texture

		gl.glBindTexture(types[m_iteration].target, *texture);

		if (types[m_iteration].isArrayType)
			gl.glTexStorage3DMultisample(types[m_iteration].target, 1, types[m_iteration].internalFormat, 16, 16, 16, GL_FALSE);
		else
			gl.glTexStorage2DMultisample(types[m_iteration].target, 1, types[m_iteration].internalFormat, 16, 16, GL_FALSE);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup texture");

		// set param

		gl.glTexParameteri(types[m_iteration].target, getParamGLEnum(), getParamValue());
		error = gl.glGetError();

		// expect failure

		if (error != getExpectedError())
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Got unexpected error: " << glu::getErrorStr(error) << ", expected: " << glu::getErrorStr(getExpectedError()) << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got wrong error code");
		}
	}

	if (++m_iteration < DE_LENGTH_OF_ARRAY(types))
		return CONTINUE;
	return STOP;
}